

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

gvector gvector_reserve(gvector v,size_t capacity)

{
  size_t *psVar1;
  
  if (v != (gvector)0x0) {
    psVar1 = (size_t *)
             realloc((void *)((long)v + -0x18),*(long *)((long)v + -0x10) * capacity + 0x18);
    if (psVar1 == (size_t *)0x0) {
      psVar1 = (size_t *)0x0;
    }
    else {
      *psVar1 = capacity;
      if (capacity < psVar1[2]) {
        psVar1[2] = capacity;
      }
      psVar1 = psVar1 + 3;
    }
    return psVar1;
  }
  return (gvector)0x0;
}

Assistant:

gvector gvector_reserve(gvector v, size_t capacity)
{
  if (v)
  {
    struct gvector_header *w = ((struct gvector_header*)v) - 1;
    struct gvector_header *u = realloc(w, sizeof(struct gvector_header) + capacity * w->size);
    if (u)
    {
      u->capacity = capacity;
      if (u->length > u->capacity)
      {
        u->length = u->capacity;
      }
      ++u;
    }
    return u;
  }
  return NULL;
}